

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O2

void little2_updatePosition(ENCODING *enc,char *ptr,char *end,POSITION *pos)

{
  byte *pbVar1;
  
LAB_00175605:
  do {
    while( true ) {
      if ((long)end - (long)ptr < 2) {
        return;
      }
      if (3 < ((byte *)ptr)[1] - 0xd8) break;
switchD_00175654_caseD_7:
      ptr = (char *)((byte *)ptr + 4);
      pos->columnNumber = pos->columnNumber + 1;
    }
    if (((byte *)ptr)[1] != 0) {
switchD_00175654_caseD_5:
      ptr = (char *)((byte *)ptr + 2);
      pos->columnNumber = pos->columnNumber + 1;
      goto LAB_00175605;
    }
    switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*ptr)) {
    default:
      goto switchD_00175654_caseD_5;
    case 6:
      ptr = (char *)((byte *)ptr + 3);
      pos->columnNumber = pos->columnNumber + 1;
      break;
    case 7:
      goto switchD_00175654_caseD_7;
    case 9:
      pos->lineNumber = pos->lineNumber + 1;
      pbVar1 = (byte *)ptr + 2;
      if (((1 < (long)end - (long)pbVar1) && (((byte *)ptr)[3] == 0)) &&
         (*(char *)((long)enc[1].scanners + (ulong)((byte *)ptr)[2]) == '\n')) {
        pbVar1 = (byte *)ptr + 4;
      }
      ptr = (char *)pbVar1;
      pos->columnNumber = 0;
      break;
    case 10:
      pos->columnNumber = 0;
      pos->lineNumber = pos->lineNumber + 1;
      ptr = (char *)((byte *)ptr + 2);
    }
  } while( true );
}

Assistant:

static void PTRCALL
PREFIX(updatePosition)(const ENCODING *enc, const char *ptr, const char *end,
                       POSITION *pos) {
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
#  define LEAD_CASE(n)                                                         \
  case BT_LEAD##n:                                                             \
    ptr += n; /* NOTE: The encoding has already been validated. */             \
    pos->columnNumber++;                                                       \
    break;
      LEAD_CASE(2)
      LEAD_CASE(3)
      LEAD_CASE(4)
#  undef LEAD_CASE
    case BT_LF:
      pos->columnNumber = 0;
      pos->lineNumber++;
      ptr += MINBPC(enc);
      break;
    case BT_CR:
      pos->lineNumber++;
      ptr += MINBPC(enc);
      if (HAS_CHAR(enc, ptr, end) && BYTE_TYPE(enc, ptr) == BT_LF)
        ptr += MINBPC(enc);
      pos->columnNumber = 0;
      break;
    default:
      ptr += MINBPC(enc);
      pos->columnNumber++;
      break;
    }
  }
}